

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(double,_double)>,_density::basic_default_allocator<65536UL>_>
::clean_dead_elements
          (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(double,_double)>,_density::basic_default_allocator<65536UL>_>
           *this)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  ControlBlock *i_page;
  
  pCVar2 = this->m_head;
  while ((i_page = pCVar2, i_page != this->m_tail &&
         (uVar1 = i_page->m_next, ((uint)uVar1 & 3) == 2))) {
    if ((uVar1 & 4) != 0) {
      aligned_deallocate((void *)i_page[3].m_next,i_page[4].m_next,i_page[5].m_next,0);
    }
    pCVar2 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
    if (0xffff < (uVar1 ^ (ulong)i_page)) {
      basic_default_allocator<65536UL>::deallocate_page
                ((basic_default_allocator<65536UL> *)this,i_page);
    }
  }
  this->m_head = i_page;
  return;
}

Assistant:

void clean_dead_elements() noexcept
        {
            auto curr = m_head;
            while (curr != m_tail)
            {
                // break if the current block is busy or is not dead
                if (
                  (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead)
                {
                    break;
                }

                auto next =
                  reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
                if (curr->m_next & detail::Queue_External)
                {
                    auto result = address_add(curr, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
                    const auto & block = *static_cast<ExternalBlock *>(result);
                    ALLOCATOR_TYPE::deallocate(block.m_element, block.m_size, block.m_alignment);
                }

                if (!same_page(next, curr))
                {
                    allocator_type::deallocate_page(curr);
                }

                curr = next;
            }

            DENSITY_ASSERT_INTERNAL(
              curr == m_tail ||
              (curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) != detail::Queue_Dead);
            m_head = curr;
        }